

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_xbm.c
# Opt level: O1

gdImagePtr gdImageCreateFromXbm(FILE *fd)

{
  int iVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  gdImagePtr im;
  int iVar7;
  uint uVar8;
  int iVar9;
  char h [8];
  uint b;
  int value;
  char iname [255];
  char fline [255];
  int local_25c;
  undefined1 local_258;
  undefined1 local_257;
  undefined1 local_256;
  undefined1 local_255;
  undefined1 local_254;
  FILE *local_250;
  int local_244;
  uint local_240;
  int local_23c;
  char local_238 [256];
  char local_138 [254];
  undefined1 local_3a;
  
  rewind((FILE *)fd);
  local_250 = (FILE *)fd;
  pcVar4 = fgets(local_138,0xff,(FILE *)fd);
  if (pcVar4 == (char *)0x0) {
    local_25c = 0;
    iVar9 = 0;
    iVar2 = 0;
    iVar7 = 0;
  }
  else {
    iVar7 = 0;
    iVar9 = 0;
    local_25c = 0;
    iVar3 = 0;
    do {
      local_3a = 0;
      sVar5 = strlen(local_138);
      if (sVar5 == 0xfe) {
        return (gdImagePtr)0x0;
      }
      iVar1 = __isoc99_sscanf(local_138,"#define %s %d",local_238,&local_23c);
      iVar2 = iVar3;
      if (iVar1 == 2) {
        pcVar6 = strrchr(local_238,0x5f);
        pcVar4 = pcVar6 + 1;
        if (pcVar6 == (char *)0x0) {
          pcVar4 = local_238;
        }
        iVar1 = strcmp("width",pcVar4);
        iVar3 = local_23c;
        if (iVar1 == 0) {
          local_25c = local_23c;
        }
        iVar1 = strcmp("height",pcVar4);
        if (iVar1 == 0) {
          iVar9 = iVar3;
        }
      }
      else {
        iVar1 = __isoc99_sscanf(local_138,"static unsigned char %s = {",local_238);
        iVar2 = 0x80;
        if (((iVar1 != 1) &&
            (iVar1 = __isoc99_sscanf(local_138,"static char %s = {",local_238), iVar1 != 1)) &&
           ((iVar2 = __isoc99_sscanf(local_138,"static unsigned short %s = {",local_238), iVar2 == 1
            || (iVar1 = __isoc99_sscanf(local_138,"static short %s = {",local_238), iVar2 = iVar3,
               iVar1 == 1)))) {
          iVar2 = 0x8000;
        }
        if (iVar2 == 0) {
          iVar2 = 0;
        }
        else {
          iVar7 = ((uint)(iVar9 * local_25c) >> 3) + 1;
          pcVar6 = strrchr(local_238,0x5f);
          pcVar4 = pcVar6 + 1;
          if (pcVar6 == (char *)0x0) {
            pcVar4 = local_238;
          }
          iVar3 = strcmp("bits[]",pcVar4);
          if (iVar3 == 0) break;
        }
      }
      pcVar4 = fgets(local_138,0xff,local_250);
      iVar3 = iVar2;
    } while (pcVar4 != (char *)0x0);
  }
  if ((iVar2 != 0 && iVar7 != 0) && (im = gdImageCreate(local_25c,iVar9), im != (gdImagePtr)0x0)) {
    gdImageColorAllocate(im,0xff,0xff,0xff);
    gdImageColorAllocate(im,0,0,0);
    local_256 = 0;
    local_254 = 0;
    if (iVar7 != 0) {
      local_25c = 0;
      iVar9 = 0;
      local_244 = 0;
      do {
        do {
          iVar3 = getc(local_250);
          if (iVar3 == -1) goto LAB_00125dd4;
        } while (iVar3 != 0x78);
        iVar3 = getc(local_250);
        if (iVar3 == -1) break;
        local_258 = (undefined1)iVar3;
        iVar3 = getc(local_250);
        if (iVar3 == -1) break;
        local_257 = (undefined1)iVar3;
        if (iVar2 == 0x8000) {
          iVar3 = getc(local_250);
          if (iVar3 == -1) break;
          local_256 = (undefined1)iVar3;
          iVar3 = getc(local_250);
          if (iVar3 == -1) break;
          local_255 = (undefined1)iVar3;
        }
        __isoc99_sscanf(&local_258,"%x",&local_240);
        if (iVar2 != 0) {
          uVar8 = 1;
          iVar3 = iVar9;
          do {
            iVar9 = iVar3 + 1;
            gdImageSetPixel(im,iVar3,local_25c,(uint)((local_240 & uVar8) != 0));
            if (iVar9 == im->sx) {
              local_25c = local_25c + 1;
              iVar9 = 0;
              if (local_25c == im->sy) {
                return im;
              }
              break;
            }
            uVar8 = uVar8 * 2;
            iVar3 = iVar9;
          } while ((int)uVar8 <= iVar2);
        }
        local_244 = local_244 + 1;
      } while (local_244 != iVar7);
    }
LAB_00125dd4:
    gd_error("EOF before image was complete");
    gdImageDestroy(im);
  }
  return (gdImagePtr)0x0;
}

Assistant:

BGD_DECLARE(gdImagePtr) gdImageCreateFromXbm(FILE * fd)
{
	char fline[MAX_XBM_LINE_SIZE];
	char iname[MAX_XBM_LINE_SIZE];
	char *type;
	int value;
	unsigned int width = 0, height = 0;
	int fail = 0;
	int max_bit = 0;

	gdImagePtr im;
	int bytes = 0, i;
	int bit, x = 0, y = 0;
	int ch;
	char h[8];
	unsigned int b;

	rewind(fd);
	while (fgets(fline, MAX_XBM_LINE_SIZE, fd)) {
		fline[MAX_XBM_LINE_SIZE-1] = '\0';
		if (strlen(fline) == MAX_XBM_LINE_SIZE-1) {
			return 0;
		}
		if (sscanf(fline, "#define %s %d", iname, &value) == 2) {
			if (!(type = strrchr(iname, '_'))) {
				type = iname;
			} else {
				type++;
			}

			if (!strcmp("width", type)) {
				width = (unsigned int) value;
			}
			if (!strcmp("height", type)) {
				height = (unsigned int) value;
			}
		} else {
			if ( sscanf(fline, "static unsigned char %s = {", iname) == 1
			  || sscanf(fline, "static char %s = {", iname) == 1)
			{
				max_bit = 128;
			} else if (sscanf(fline, "static unsigned short %s = {", iname) == 1
					|| sscanf(fline, "static short %s = {", iname) == 1)
			{
				max_bit = 32768;
			}
			if (max_bit) {
				bytes = (width * height / 8) + 1;
				if (!bytes) {
					return 0;
				}
				if (!(type = strrchr(iname, '_'))) {
					type = iname;
				} else {
					type++;
				}
				if (!strcmp("bits[]", type)) {
					break;
				}
			}
 		}
	}
	if (!bytes || !max_bit) {
		return 0;
	}

	if(!(im = gdImageCreate(width, height))) {
		return 0;
	}
	gdImageColorAllocate(im, 255, 255, 255);
	gdImageColorAllocate(im, 0, 0, 0);
	h[2] = '\0';
	h[4] = '\0';
	for (i = 0; i < bytes; i++) {
		while (1) {
			if ((ch=getc(fd)) == EOF) {
				fail = 1;
				break;
			}
			if (ch == 'x') {
				break;
			}
		}
		if (fail) {
			break;
		}
		/* Get hex value */
		if ((ch=getc(fd)) == EOF) {
			break;
		}
		h[0] = ch;
		if ((ch=getc(fd)) == EOF) {
			break;
		}
		h[1] = ch;
		if (max_bit == 32768) {
			if ((ch=getc(fd)) == EOF) {
				break;
			}
			h[2] = ch;
			if ((ch=getc(fd)) == EOF) {
				break;
			}
			h[3] = ch;
		}
		sscanf(h, "%x", &b);
		for (bit = 1; bit <= max_bit; bit = bit << 1) {
			gdImageSetPixel(im, x++, y, (b & bit) ? 1 : 0);
			if (x == im->sx) {
				x = 0;
				y++;
				if (y == im->sy) {
					return im;
				}
				break;
			}
		}
	}

	gd_error("EOF before image was complete");
	gdImageDestroy(im);
	return 0;
}